

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::deinit
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this)

{
  TessellationShaderUtils *this_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference run;
  __normal_iterator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_*,_std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>_>
  local_28;
  __normal_iterator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_*,_std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>_>
  local_20;
  iterator it;
  Functions *gl;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this_local;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar2 = (*pRVar4->_vptr_RenderContext[3])();
    it._M_current = (_run *)CONCAT44(extraout_var,iVar2);
    (**(code **)&it._M_current[0x1a].drawcall_is_indiced)(0x8c89);
    dVar3 = (**(code **)&it._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glDisable(GL_RASTERIZER_DISCARD) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x30e);
    (**(code **)&it._M_current[0x1a].drawcall_is_indiced)(0x8d69);
    dVar3 = (**(code **)&it._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glDisable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x311);
    (**(code **)&it._M_current[1].n_instances)(0x8c8e,0);
    (**(code **)&it._M_current[1].n_restart_indices)(0x8c8e,0);
    (**(code **)&it._M_current[0x54].n_restart_indices)
              ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    (**(code **)&it._M_current[4].n_restart_indices)(0);
    if (this->m_bo_id != 0) {
      (**(code **)&it._M_current[0x16].n_restart_indices)(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_fs_id != 0) {
      (**(code **)&it._M_current[0x17].po_id)(this->m_fs_id);
      this->m_fs_id = 0;
    }
    if (this->m_vs_id != 0) {
      (**(code **)&it._M_current[0x17].po_id)(this->m_vs_id);
      this->m_vs_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)&it._M_current[0x18].n_instances)(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    local_20._M_current =
         (_run *)std::
                 vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
                 ::begin(&this->m_runs);
    while( true ) {
      local_28._M_current =
           (_run *)std::
                   vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
                   ::end(&this->m_runs);
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      run = __gnu_cxx::
            __normal_iterator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_*,_std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>_>
            ::operator*(&local_20);
      deinitRun(this,run);
      __gnu_cxx::
      __normal_iterator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_*,_std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>_>
      ::operator++(&local_20);
    }
    std::
    vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
    ::clear(&this->m_runs);
    if (this->m_utils_ptr != (TessellationShaderUtils *)0x0) {
      this_00 = this->m_utils_ptr;
      if (this_00 != (TessellationShaderUtils *)0x0) {
        TessellationShaderUtils::~TessellationShaderUtils(this_00);
        operator_delete(this_00,0x20);
      }
      this->m_utils_ptr = (TessellationShaderUtils *)0x0;
    }
  }
  return;
}

Assistant:

void TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::deinit()
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Disable modes this test has enabled */
	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) failed");

	gl.disable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed");

	/* Remove TF buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Restore GL_PATCH_VERTICES_EXT value */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Free all ES objects we allocated for the test */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	/* Deinitialize all run descriptors */
	for (_runs::iterator it = m_runs.begin(); it != m_runs.end(); ++it)
	{
		deinitRun(*it);
	}
	m_runs.clear();

	/* Release tessellation shader test utilities instance */
	if (m_utils_ptr != NULL)
	{
		delete m_utils_ptr;

		m_utils_ptr = NULL;
	}
}